

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsGraph.h
# Opt level: O3

bool __thiscall
dg::vr::RelationsGraph<dg::vr::ValueRelations>::haveConflictingRelation
          (RelationsGraph<dg::vr::ValueRelations> *this,Bucket *lt,Type type,Bucket *rt,
          Relations *maybeBetween)

{
  pointer prVar1;
  _Base_bitset<1UL> _Var2;
  ulong uVar3;
  Bucket *lt_00;
  
  while (lt_00 = lt, type == PF) {
    type = dg::vr::Relations::inverted(PF);
    maybeBetween = (Relations *)0x0;
    lt = rt;
    rt = lt_00;
  }
  if (type < PT) {
    if (maybeBetween != (Relations *)0x0) {
      _Var2._M_w = (maybeBetween->bits).super__Base_bitset<1UL>._M_w;
      goto LAB_00124cfd;
    }
  }
  else {
    if (type != PT) {
      abort();
    }
    prVar1 = (lt_00->relatedBuckets)._M_elems[10].vec.
             super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    type = EQ;
    if (prVar1 == (lt_00->relatedBuckets)._M_elems[10].vec.
                  super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      return false;
    }
    lt_00 = prVar1->_M_data;
  }
  _Var2._M_w = (_WordT)relationsBetween(this,lt_00,rt);
LAB_00124cfd:
  uVar3 = dg::vr::Relations::conflicting(type);
  return (uVar3 & _Var2._M_w) != 0;
}

Assistant:

bool haveConflictingRelation(const Bucket &lt, Relations::Type type,
                                 const Bucket &rt,
                                 Relations *maybeBetween = nullptr) const {
        switch (type) {
        case Relations::EQ:
        case Relations::NE:
        case Relations::SLT:
        case Relations::SLE:
        case Relations::ULT:
        case Relations::ULE:
        case Relations::SGT:
        case Relations::SGE:
        case Relations::UGT:
        case Relations::UGE: {
            Relations between = fromMaybeBetween(lt, rt, maybeBetween);
            return between.conflictsWith(type);
        }
        case Relations::PT:
            return lt.hasRelation(type) &&
                   haveConflictingRelation(lt.getRelated(type), Relations::EQ,
                                           rt);
        case Relations::PF:
            return haveConflictingRelation(rt, Relations::inverted(type), lt);
        }
        assert(0 && "unreachable");
        abort();
    }